

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osgen3.c
# Opt level: O0

void osgen_disp_trunc(osgen_win_t *win,int y,int x,int oss_color,char *p)

{
  int in_EDX;
  int in_ESI;
  long in_RDI;
  char *in_R8;
  size_t cur;
  size_t wid_rem;
  size_t chars_rem;
  char buf [64];
  int in_stack_ffffffffffffff6c;
  int in_stack_ffffffffffffff70;
  int line;
  size_t local_80;
  ulong local_78;
  ulong local_70;
  undefined1 local_68 [72];
  char *local_20;
  int local_10;
  int local_c;
  long local_8;
  
  if ((S_deferred_redraw == 0) && ((*(uint *)(in_RDI + 4) & 4) == 0)) {
    local_20 = in_R8;
    local_10 = in_EDX;
    local_c = in_ESI;
    local_8 = in_RDI;
    local_70 = strlen(in_R8);
    line = local_10;
    if (local_10 < 0) {
      line = 0;
    }
    local_78 = *(long *)(local_8 + 0x38) - (long)line;
    if ((((-1 < local_c) && (local_c < (int)*(undefined8 *)(local_8 + 0x40))) &&
        (0 < local_10 + (int)local_70)) && (local_10 < (int)*(undefined8 *)(local_8 + 0x38))) {
      if (local_10 < 0) {
        local_10 = -local_10;
        if (local_70 <= (ulong)(long)local_10) {
          return;
        }
        local_70 = local_70 - (long)local_10;
        local_20 = local_20 + local_10;
        local_10 = 0;
      }
      if (local_70 < local_78) {
        ossdsp(line,in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,(char *)0x228146);
      }
      else {
        for (; local_78 != 0; local_78 = local_78 - local_80) {
          local_80 = local_78;
          if (0x3f < local_78) {
            local_80 = 0x3f;
          }
          memcpy(local_68,local_20,local_80);
          local_68[local_80] = 0;
          ossdsp(line,in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,(char *)0x2281c7);
          local_10 = local_10 + (int)local_80;
          local_20 = local_20 + local_80;
        }
      }
    }
  }
  return;
}

Assistant:

static void osgen_disp_trunc(osgen_win_t *win, int y, int x, int oss_color,
                             const char *p)
{
    char buf[64];
    size_t chars_rem;
    size_t wid_rem;

    /* if we have deferred redrawing pending, don't bother drawing now */
    if (S_deferred_redraw || (win->flags & OSGEN_DEFER_REDRAW) != 0)
        return;

    /* get the number of characters to be displayed */
    chars_rem = strlen(p);

    /* calculate the amount of space we have to work with on the screen */
    wid_rem = win->wid - (x >= 0 ? x : 0);

    /* make sure at least some of the text overlaps the window */
    if (y < 0 || y >= (int)win->ht
        || x + (int)chars_rem <= 0 || x >= (int)win->wid)
        return;

    /* 
     *   if we're starting to the left of the window, skip characters up to
     *   the first character visible in the window 
     */
    if (x < 0)
    {
        /* 
         *   get the number of characters to skip - this is simply the
         *   negative of the x position, since x position zero is the first
         *   column to display 
         */
        x = -x;

        /* 
         *   if we don't have enough characters to reach the left edge of
         *   the window, we have nothing to do 
         */
        if (chars_rem <= (size_t)x)
            return;

        /* skip the desired number of characters */
        chars_rem -= x;
        p += x;

        /* we've skipped up to column zero, so proceed from there */
        x = 0;
    }

    /* if the text entirely fits, display it and we're done */
    if (chars_rem < wid_rem)
    {
        /* display the entire string */
        ossdsp(win->winy + y, win->winx + x, oss_color, p);

        /* done */
        return;
    }

    /* 
     *   we have too much to display, so display as much as will fit - keep
     *   going until we run out of space for the display (we know we'll run
     *   out of space before we run out of text, because we know we have too
     *   much text to fit) 
     */
    while (wid_rem != 0)
    {
        size_t cur;

        /* display as much as will fit, up to our buffer length */
        cur = wid_rem;
        if (cur > sizeof(buf) - 1)
            cur = sizeof(buf) - 1;

        /* copy this portion to our buffer and null-terminate it */
        memcpy(buf, p, cur);
        buf[cur] = '\0';

        /* display it */
        ossdsp(win->winy + y, win->winx + x, oss_color, buf);

        /* advance our screen position */
        x += cur;

        /* advance past the source material we just displayed */
        p += cur;

        /* deduct the on-screen space we consumed from the remaining space */
        wid_rem -= cur;
    }
}